

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.hpp
# Opt level: O2

unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>,_true> __thiscall
duckdb::
make_uniq_base<duckdb::AlterInfo,duckdb::AddColumnInfo,duckdb::AlterEntryData,duckdb::ColumnDefinition,bool_const&>
          (duckdb *this,AlterEntryData *args,ColumnDefinition *args_1,bool *args_2)

{
  AddColumnInfo *this_00;
  AlterEntryData local_170;
  ColumnDefinition local_108;
  
  this_00 = (AddColumnInfo *)operator_new(0x158);
  AlterEntryData::AlterEntryData(&local_170,args);
  ColumnDefinition::ColumnDefinition(&local_108,args_1);
  AddColumnInfo::AddColumnInfo(this_00,&local_170,&local_108,*args_2);
  *(AddColumnInfo **)this = this_00;
  ColumnDefinition::~ColumnDefinition(&local_108);
  AlterEntryData::~AlterEntryData(&local_170);
  return (unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>)
         (unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>)this;
}

Assistant:

unique_ptr<S> make_uniq_base(ARGS &&... args) { // NOLINT: mimic std style
	return unique_ptr<S>(new T(std::forward<ARGS>(args)...));
}